

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O3

void * dexpand(int_t *prev_len,MemType type,int_t len_to_copy,int keep_prev,GlobalLU_t *Glu)

{
  int iVar1;
  ExpHeader *pEVar2;
  char *src;
  int iVar3;
  int_t *piVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  MemType MVar8;
  void *old;
  int iVar9;
  long lVar10;
  void *pvVar11;
  int iVar12;
  int iVar13;
  double *dnew;
  float fVar14;
  float local_44;
  
  pEVar2 = Glu->expanders;
  iVar3 = *prev_len;
  iVar13 = (int)((float)iVar3 * 1.5);
  if (Glu->num_expansions == 0) {
    iVar13 = iVar3;
  }
  if (keep_prev != 0) {
    iVar13 = iVar3;
  }
  MVar8 = type & ~UCOL;
  if (Glu->MemModel == SYSTEM) {
    bVar5 = MVar8 == LSUB ^ 3;
    pvVar11 = superlu_malloc((long)iVar13 << bVar5);
    if (Glu->num_expansions != 0) {
      if (keep_prev == 0) {
        if (pvVar11 == (void *)0x0) {
          local_44 = 1.5;
          iVar3 = 0xb;
          do {
            iVar3 = iVar3 + -1;
            if (iVar3 == 0) {
              return (void *)0x0;
            }
            local_44 = (local_44 + 1.0) * 0.5;
            iVar13 = (int)((float)*prev_len * local_44);
            pvVar11 = superlu_malloc((long)iVar13 << bVar5);
          } while (pvVar11 == (void *)0x0);
        }
      }
      else if (pvVar11 == (void *)0x0) {
        return (void *)0x0;
      }
      old = pEVar2[type].mem;
      if (MVar8 == LSUB) {
        copy_mem_int(len_to_copy,old,pvVar11);
        old = pEVar2[type].mem;
      }
      else if (0 < len_to_copy) {
        uVar7 = 0;
        do {
          *(undefined8 *)((long)pvVar11 + uVar7 * 8) = *(undefined8 *)((long)old + uVar7 * 8);
          uVar7 = uVar7 + 1;
        } while ((uint)len_to_copy != uVar7);
      }
      superlu_free(old);
    }
    pEVar2[type].mem = pvVar11;
  }
  else if (Glu->num_expansions == 0) {
    iVar12 = iVar13 << (MVar8 == LSUB ^ 3U);
    iVar6 = (Glu->stack).used;
    iVar3 = iVar6 + iVar12;
    if (iVar3 < (Glu->stack).size) {
      iVar6 = (Glu->stack).top1;
      pvVar11 = (void *)((long)iVar6 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar12 + iVar6;
      (Glu->stack).used = iVar3;
      iVar6 = iVar3;
    }
    else {
      pvVar11 = (void *)0x0;
    }
    if ((type < LSUB) && (iVar3 = (int)pvVar11, ((ulong)pvVar11 & 7) != 0)) {
      uVar7 = (long)pvVar11 + 7;
      pvVar11 = (void *)(uVar7 & 0xfffffffffffffff8);
      iVar3 = ((uint)uVar7 & 0xfffffff8) - iVar3;
      piVar4 = &(Glu->stack).top1;
      *piVar4 = *piVar4 + iVar3;
      (Glu->stack).used = iVar6 + iVar3;
    }
    pEVar2[type].mem = pvVar11;
  }
  else {
    bVar5 = MVar8 == LSUB ^ 3;
    iVar12 = iVar13 - iVar3 << bVar5;
    iVar6 = (Glu->stack).used;
    if (keep_prev == 0) {
      iVar1 = (Glu->stack).size;
      if (iVar1 <= iVar6 + iVar12) {
        fVar14 = 1.5;
        iVar9 = 0xb;
        do {
          iVar9 = iVar9 + -1;
          if (iVar9 == 0) {
            return (void *)0x0;
          }
          fVar14 = (fVar14 + 1.0) * 0.5;
          iVar13 = (int)(fVar14 * (float)iVar3);
          iVar12 = iVar13 - iVar3 << bVar5;
        } while (iVar1 <= iVar6 + iVar12);
      }
    }
    else if ((Glu->stack).size <= iVar6 + iVar12) {
      return (void *)0x0;
    }
    if (type != USUB) {
      src = (char *)pEVar2[type + UCOL].mem;
      lVar10 = (long)iVar12;
      user_bcopy(src,src + lVar10,(*(int *)&(Glu->stack).array + (Glu->stack).top1) - (int)src);
      if (type < USUB) {
        piVar4 = (int_t *)((long)pEVar2[3].mem + lVar10);
        pEVar2[3].mem = piVar4;
        Glu->usub = piVar4;
        if (type != LSUB) {
          piVar4 = (int_t *)((long)pEVar2[2].mem + lVar10);
          pEVar2[2].mem = piVar4;
          Glu->lsub = piVar4;
          if (type == LUSUP) {
            pvVar11 = (void *)(lVar10 + (long)pEVar2[1].mem);
            pEVar2[1].mem = pvVar11;
            Glu->ucol = pvVar11;
          }
        }
      }
      iVar3 = (Glu->stack).top1 + iVar12;
      (Glu->stack).top1 = iVar3;
      iVar6 = (Glu->stack).used + iVar12;
      (Glu->stack).used = iVar6;
      if (type == UCOL) {
        (Glu->stack).top1 = iVar3 + iVar12;
        (Glu->stack).used = iVar6 + iVar12;
      }
    }
  }
  pEVar2[type].size = iVar13;
  *prev_len = iVar13;
  if (Glu->num_expansions != 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
  }
  return pEVar2[type].mem;
}

Assistant:

void
*dexpand (
	 int_t *prev_len,   /* length used from previous call */
	 MemType type,    /* which part of the memory to expand */
	 int_t len_to_copy, /* size of the memory to be copied to new store */
	 int keep_prev,   /* = 1: use prev_len;
			     = 0: compute new_len to expand */
	 GlobalLU_t *Glu  /* modified - global LU data structures */
	)
{
    float    EXPAND = 1.5;
    float    alpha;
    void     *new_mem, *old_mem;
    int_t    new_len, bytes_to_copy;
    int      tries, lword, extra;
    ExpHeader *expanders = Glu->expanders; /* Array of 4 types of memory */

    alpha = EXPAND;

    if ( Glu->num_expansions == 0 || keep_prev ) {
        /* First time allocate requested */
        new_len = *prev_len;
    } else {
	new_len = alpha * *prev_len;
    }
    
    if ( type == LSUB || type == USUB ) lword = sizeof(int_t);
    else lword = sizeof(double);

    if ( Glu->MemModel == SYSTEM ) {
	new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
	if ( Glu->num_expansions != 0 ) {
	    tries = 0;
	    if ( keep_prev ) {
		if ( !new_mem ) return (NULL);
	    } else {
		while ( !new_mem ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
		}
	    }
	    if ( type == LSUB || type == USUB ) {
		copy_mem_int(len_to_copy, expanders[type].mem, new_mem);
	    } else {
		copy_mem_double(len_to_copy, expanders[type].mem, new_mem);
	    }
	    SUPERLU_FREE (expanders[type].mem);
	}
	expanders[type].mem = (void *) new_mem;
	
    } else { /* MemModel == USER */
    
	if ( Glu->num_expansions == 0 ) { /* First time initialization */
	
	    new_mem = duser_malloc(new_len * lword, HEAD, Glu);
	    if ( NotDoubleAlign(new_mem) &&
		(type == LUSUP || type == UCOL) ) {
		old_mem = new_mem;
		new_mem = (void *)DoubleAlign(new_mem);
		extra = (char*)new_mem - (char*)old_mem;
#if ( DEBUGlevel>=1 )
		printf("expand(): not aligned, extra %d\n", extra);
#endif		
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
	    }
	    
	    expanders[type].mem = (void *) new_mem;
	    
	} else { /* CASE: num_expansions != 0 */
	
	    tries = 0;
	    extra = (new_len - *prev_len) * lword;
	    if ( keep_prev ) {
		if ( StackFull(extra) ) return (NULL);
	    } else {
		while ( StackFull(extra) ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    extra = (new_len - *prev_len) * lword;	    
		}
	    }

	      /* Need to expand the memory: moving the content after the current MemType
	      	 to make extra room for the current MemType.
              	 Memory layout: [ LUSUP || UCOL || LSUB || USUB ]
	      */
  	    if ( type != USUB ) {
		new_mem = (void*)((char*)expanders[type + 1].mem + extra);
		bytes_to_copy = (char*)Glu->stack.array + Glu->stack.top1
		    - (char*)expanders[type + 1].mem;
		user_bcopy(expanders[type+1].mem, new_mem, bytes_to_copy);

		if ( type < USUB ) {
		    Glu->usub = expanders[USUB].mem =
			(void*)((char*)expanders[USUB].mem + extra);
		}
		if ( type < LSUB ) {
		    Glu->lsub = expanders[LSUB].mem =
			(void*)((char*)expanders[LSUB].mem + extra);
		}
		if ( type < UCOL ) {
		    Glu->ucol = expanders[UCOL].mem =
			(void*)((char*)expanders[UCOL].mem + extra);
		}
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
		if ( type == UCOL ) {
		    Glu->stack.top1 += extra;   /* Add same amount for USUB */
		    Glu->stack.used += extra;
		}
		
	    } /* end expansion */

	} /* else ... */
    }

    expanders[type].size = new_len;
    *prev_len = new_len;
    if ( Glu->num_expansions ) ++Glu->num_expansions;
    
    return (void *) expanders[type].mem;
    
}